

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Request * __thiscall
kj::anon_unknown_31::ConcurrencyLimitingHttpClient::request
          (Request *__return_storage_ptr__,ConcurrencyLimitingHttpClient *this,HttpMethod method,
          StringPtr url,HttpHeaders *headers,Maybe<unsigned_long> *expectedBodySize)

{
  AsyncOutputStream *pAVar1;
  TransformPromiseNodeBase *this_00;
  int __flags;
  char *pcVar2;
  StringPtr *params;
  void *__child_stack;
  void *__arg;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:3979:15),_kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  combined;
  PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  paf;
  String urlCopy;
  SplitTuplePromise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>_>
  split;
  HttpHeaders headersCopy;
  Own<kj::(anonymous_namespace)::PromiseOutputStream> local_1c8;
  Own<kj::_::PromiseNode> local_1b8;
  PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  local_1a8;
  Array<char> local_188;
  char local_168 [8];
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_160;
  char *local_158;
  void *local_150;
  Request local_148;
  ArrayDisposer *pAStack_128;
  HttpHeaders local_120;
  char local_c0;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_b8;
  undefined1 local_a8 [112];
  _Map_pointer local_38;
  
  __arg = (void *)url.content.size_;
  pcVar2 = url.content.ptr;
  local_158 = pcVar2;
  local_150 = __arg;
  if (this->concurrentRequests < this->maxConcurrentRequests) {
    this->concurrentRequests = this->concurrentRequests + 1;
    local_168[0] = (expectedBodySize->ptr).isSet;
    if ((bool)local_168[0] == true) {
      local_160 = (expectedBodySize->ptr).field_1;
    }
    local_1a8.promise.super_PromiseBase.node.disposer = (Disposer *)this;
    (**this->inner->_vptr_HttpClient)
              (&local_148,this->inner,(ulong)method,pcVar2,__arg,headers,local_168);
    fireCountChanged(this);
    attachCounter((ConcurrencyLimitingHttpClient *)local_a8,&local_148.response,
                  (ConnectionCounter *)&local_1a8);
    pAVar1 = local_148.body.ptr;
    local_148.body.ptr = (AsyncOutputStream *)0x0;
    (__return_storage_ptr__->body).disposer = local_148.body.disposer;
    (__return_storage_ptr__->body).ptr = pAVar1;
    (__return_storage_ptr__->response).super_PromiseBase.node.disposer = (Disposer *)local_a8._0_8_;
    (__return_storage_ptr__->response).super_PromiseBase.node.ptr = (PromiseNode *)local_a8._8_8_;
    local_a8._8_8_ = (StringPtr *)0x0;
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_a8);
    HttpClient::Request::~Request(&local_148);
    ConnectionCounter::~ConnectionCounter((ConnectionCounter *)&local_1a8);
  }
  else {
    newPromiseAndFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
              ();
    __flags = (int)pcVar2;
    str<kj::StringPtr&>((String *)&local_188,(kj *)&local_158,params);
    HttpHeaders::clone((HttpHeaders *)local_a8,(__fn *)headers,__child_stack,__flags,__arg);
    local_148.body.ptr = (AsyncOutputStream *)CONCAT44(local_148.body.ptr._4_4_,method);
    local_148.response.super_PromiseBase.node.disposer = (Disposer *)local_188.ptr;
    local_148.response.super_PromiseBase.node.ptr = (PromiseNode *)local_188.size_;
    pAStack_128 = local_188.disposer;
    local_188.ptr = (char *)0x0;
    local_188.size_ = 0;
    local_148.body.disposer = (Disposer *)this;
    HttpHeaders::HttpHeaders(&local_120,(HttpHeaders *)local_a8);
    local_c0 = (expectedBodySize->ptr).isSet;
    if ((bool)local_c0 == true) {
      local_b8 = (expectedBodySize->ptr).field_1;
    }
    this_00 = (TransformPromiseNodeBase *)operator_new(0xc0);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(Own<kj::_::PromiseNode> *)&local_1a8,
               _::
               TransformPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>,_kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:3979:15),_kj::_::PropagateException>
               ::anon_class_152_5_1d7fcda0_for_func::operator());
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0042b8c0;
    this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)local_148.body.disposer;
    *(undefined4 *)&this_00[1].dependency.disposer = local_148.body.ptr._0_4_;
    this_00[1].dependency.ptr = (PromiseNode *)local_148.response.super_PromiseBase.node.disposer;
    this_00[1].continuationTracePtr = local_148.response.super_PromiseBase.node.ptr;
    this_00[2].super_PromiseNode._vptr_PromiseNode = (_func_int **)pAStack_128;
    local_148.response.super_PromiseBase.node.disposer = (Disposer *)0x0;
    local_148.response.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    HttpHeaders::HttpHeaders((HttpHeaders *)&this_00[2].dependency,&local_120);
    *(char *)&this_00[5].dependency.disposer = local_c0;
    if (local_c0 == '\x01') {
      this_00[5].dependency.ptr = (PromiseNode *)local_b8;
    }
    local_1c8.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,kj::Promise<kj::HttpClient::Response>>,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda(kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)#1},kj::_::PropagateException>>
          ::instance;
    local_a8._104_8_ =
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,kj::Promise<kj::HttpClient::Response>>,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda(kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)#1},kj::_::PropagateException>>
          ::instance;
    local_1c8.ptr = (PromiseOutputStream *)0x0;
    local_1b8.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,kj::Promise<kj::HttpClient::Response>>,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda(kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)#1},kj::_::PropagateException>>
          ::instance;
    local_38 = (_Map_pointer)0x0;
    local_1b8.ptr = (PromiseNode *)this_00;
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)(local_a8 + 0x68));
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_1c8);
    (anonymous_namespace)::ConcurrencyLimitingHttpClient::
    request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::
    {lambda(kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)#1}::
    ~ConnectionCounter((_lambda_kj___anonymous_namespace___ConcurrencyLimitingHttpClient__ConnectionCounter____1_
                        *)&local_148);
    Promise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>_>::
    split((SplitTuplePromise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>_>
           *)&local_148,
          (Promise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>_>
           *)&local_1b8);
    std::
    queue<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>_>,_std::deque<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>_>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>_>_>_>_>
    ::push(&this->pendingRequests,&local_1a8.fulfiller);
    fireCountChanged(this);
    heap<kj::(anonymous_namespace)::PromiseOutputStream,kj::Promise<kj::Own<kj::AsyncOutputStream>>>
              ((kj *)&local_1c8,(Promise<kj::Own<kj::AsyncOutputStream>_> *)&local_148);
    (__return_storage_ptr__->body).disposer = local_1c8.disposer;
    (__return_storage_ptr__->body).ptr = &(local_1c8.ptr)->super_AsyncOutputStream;
    local_1c8.ptr = (PromiseOutputStream *)0x0;
    (__return_storage_ptr__->response).super_PromiseBase.node.disposer =
         local_148.response.super_PromiseBase.node.disposer;
    (__return_storage_ptr__->response).super_PromiseBase.node.ptr =
         local_148.response.super_PromiseBase.node.ptr;
    local_148.response.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    Own<kj::(anonymous_namespace)::PromiseOutputStream>::~Own(&local_1c8);
    _::
    TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>,_kj::Promise<kj::HttpClient::Response>_>
    ::~TupleImpl((TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>,_kj::Promise<kj::HttpClient::Response>_>
                  *)&local_148);
    Own<kj::_::PromiseNode>::dispose(&local_1b8);
    HttpHeaders::~HttpHeaders((HttpHeaders *)local_a8);
    Array<char>::~Array(&local_188);
    PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
    ::~PromiseFulfillerPair(&local_1a8);
  }
  return __return_storage_ptr__;
}

Assistant:

Request request(HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
                  kj::Maybe<uint64_t> expectedBodySize = nullptr) override {
    if (concurrentRequests < maxConcurrentRequests) {
      auto counter = ConnectionCounter(*this);
      auto request = inner.request(method, url, headers, expectedBodySize);
      fireCountChanged();
      auto promise = attachCounter(kj::mv(request.response), kj::mv(counter));
      return { kj::mv(request.body), kj::mv(promise) };
    }

    auto paf = kj::newPromiseAndFulfiller<ConnectionCounter>();
    auto urlCopy = kj::str(url);
    auto headersCopy = headers.clone();

    auto combined = paf.promise
        .then([this,
               method,
               urlCopy = kj::mv(urlCopy),
               headersCopy = kj::mv(headersCopy),
               expectedBodySize](ConnectionCounter&& counter) mutable {
      auto req = inner.request(method, urlCopy, headersCopy, expectedBodySize);
      return kj::tuple(kj::mv(req.body), attachCounter(kj::mv(req.response), kj::mv(counter)));
    });
    auto split = combined.split();
    pendingRequests.push(kj::mv(paf.fulfiller));
    fireCountChanged();
    return { kj::heap<PromiseOutputStream>(kj::mv(kj::get<0>(split))), kj::mv(kj::get<1>(split)) };
  }